

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

Tour * tour_create(Tour *__return_storage_ptr__,Instance *instance)

{
  int iVar1;
  int32_t *piVar2;
  
  iVar1 = instance->num_customers;
  __return_storage_ptr__->num_customers = iVar1;
  __return_storage_ptr__->num_comps = 0;
  piVar2 = veci32_create(iVar1 + 1);
  __return_storage_ptr__->succ = piVar2;
  piVar2 = veci32_create(instance->num_customers + 1);
  __return_storage_ptr__->comp = piVar2;
  tour_clear(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Tour tour_create(const Instance *instance) {
    Tour result = {0};
    result.num_customers = instance->num_customers;

    result.num_comps = 0;
    result.succ = veci32_create(instance->num_customers + 1);
    result.comp = veci32_create(instance->num_customers + 1);

    tour_clear(&result);
    return result;
}